

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write_decimal<int>
          (basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
           *this,int value)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char_type buffer [13];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_48;
  char local_35 [13];
  
  uVar6 = (ulong)(uint)-value;
  if (0 < value) {
    uVar6 = (ulong)(uint)value;
  }
  uVar4 = (uint)uVar6;
  uVar7 = 0x1f;
  if ((uVar4 | 1) != 0) {
    for (; (uVar4 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar7 = (uVar7 - (uVar4 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar7 * 4))) + 1;
  uVar8 = (ulong)uVar7;
  if (value < 0) {
    local_48._M_stream = (ostream_type *)CONCAT71(local_48._M_stream._1_7_,0x2d);
    std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
              (&this->out_,(char *)&local_48);
  }
  pcVar1 = local_35 + uVar8;
  if (99 < uVar4) {
    do {
      uVar5 = (uint)uVar6;
      uVar4 = (uint)(uVar6 / 100);
      uVar6 = uVar6 / 100;
      *(undefined2 *)(pcVar1 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar5 + (int)uVar6 * -100) * 2);
      pcVar1 = pcVar1 + -2;
    } while (9999 < uVar5);
  }
  local_48._M_stream = (this->out_)._M_stream;
  local_48._M_string = (this->out_)._M_string;
  if (uVar4 < 10) {
    bVar2 = (byte)uVar4 | 0x30;
    lVar3 = -1;
  }
  else {
    pcVar1[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar4 * 2 & 0xffffffff) + 1];
    bVar2 = internal::basic_data<void>::DIGITS[(ulong)uVar4 * 2];
    lVar3 = -2;
  }
  pcVar1[lVar3] = bVar2;
  if (0 < (int)uVar7) {
    pcVar1 = local_35;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_48,pcVar1);
      pcVar1 = pcVar1 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  (this->out_)._M_stream = local_48._M_stream;
  (this->out_)._M_string = local_48._M_string;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }